

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall
google::protobuf::EnumValueDescriptorProto::MergeFrom
          (EnumValueDescriptorProto *this,EnumValueDescriptorProto *from)

{
  byte bVar1;
  int32 iVar2;
  LogMessage *other;
  string *psVar3;
  EnumValueOptions *pEVar4;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/descriptor.pb.cc"
               ,0xe03);
    other = internal::LogMessage::operator<<(&local_50,"CHECK failed: (&from) != (this): ");
    internal::LogFinisher::operator=(&local_51,other);
    internal::LogMessage::~LogMessage(&local_50);
  }
  bVar1 = (byte)from->_has_bits_[0];
  if (bVar1 != 0) {
    if ((bVar1 & 1) != 0) {
      this->_has_bits_[0] = this->_has_bits_[0] | 1;
      if (this->name_ == (string *)internal::kEmptyString_abi_cxx11_) {
        psVar3 = (string *)operator_new(0x20);
        (psVar3->_M_dataplus)._M_p = (pointer)&psVar3->field_2;
        psVar3->_M_string_length = 0;
        (psVar3->field_2)._M_local_buf[0] = '\0';
        this->name_ = psVar3;
      }
      std::__cxx11::string::_M_assign((string *)this->name_);
    }
    if ((from->_has_bits_[0] & 2) != 0) {
      iVar2 = from->number_;
      this->_has_bits_[0] = this->_has_bits_[0] | 2;
      this->number_ = iVar2;
    }
    if ((from->_has_bits_[0] & 4) != 0) {
      *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 4;
      if (this->options_ == (EnumValueOptions *)0x0) {
        pEVar4 = (EnumValueOptions *)operator_new(0x60);
        EnumValueOptions::EnumValueOptions(pEVar4);
        this->options_ = pEVar4;
      }
      pEVar4 = from->options_;
      if (pEVar4 == (EnumValueOptions *)0x0) {
        pEVar4 = *(EnumValueOptions **)(default_instance_ + 0x18);
      }
      EnumValueOptions::MergeFrom(this->options_,pEVar4);
    }
  }
  UnknownFieldSet::MergeFrom(&this->_unknown_fields_,&from->_unknown_fields_);
  return;
}

Assistant:

void EnumValueDescriptorProto::MergeFrom(const EnumValueDescriptorProto& from) {
  GOOGLE_CHECK_NE(&from, this);
  if (from._has_bits_[0 / 32] & (0xffu << (0 % 32))) {
    if (from.has_name()) {
      set_name(from.name());
    }
    if (from.has_number()) {
      set_number(from.number());
    }
    if (from.has_options()) {
      mutable_options()->::google::protobuf::EnumValueOptions::MergeFrom(from.options());
    }
  }
  mutable_unknown_fields()->MergeFrom(from.unknown_fields());
}